

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void InitClass(nodecontext *p,nodeclass *Class)

{
  byte bVar1;
  undefined4 uVar2;
  ulong __n;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  short sVar7;
  int iVar8;
  bool_t bVar9;
  nodemetalookuphead *pnVar10;
  long lVar11;
  node *pnVar12;
  char *pcVar13;
  nodeclass *pnVar14;
  char *pcVar15;
  nodemeta *pnVar16;
  array local_48;
  uintptr_t Data;
  
  if (Class->State != '\0') {
    return;
  }
  pnVar16 = Class->Meta;
  if (pnVar16 == (nodemeta *)0x0) {
    return;
  }
  pnVar14 = Class->ParentClass;
  if (Class->ParentId == 0) {
    if (pnVar14 != (nodeclass *)0x0) goto LAB_00103155;
  }
  else {
    if (pnVar14 == (nodeclass *)0x0) {
      return;
    }
    if (pnVar14->State < '\x01') {
      return;
    }
LAB_00103155:
    if (((Class->VMTSize == 0x48) && (0x48 < pnVar14->VMTSize)) &&
       (Class = NodeClassResize(p,Class,pnVar14->VMTSize), Class == (nodeclass *)0x0)) {
      return;
    }
    __n = pnVar14->VMTSize;
    if (__n < 0x48) {
      __assert_fail("Parent->VMTSize >= DEFAULT_VMT",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x485,"void InitClass(nodecontext *, nodeclass *)");
    }
    if (Class->VMTSize < __n) {
      __assert_fail("Class->VMTSize >= Parent->VMTSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x486,"void InitClass(nodecontext *, nodeclass *)");
    }
    if (*(long *)(pnVar14 + 1) != *(long *)(Class + 1)) {
      __assert_fail("NodeClass_Context(Parent) == NodeClass_Context(Class)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x487,"void InitClass(nodecontext *, nodeclass *)");
    }
    uVar2 = *(undefined4 *)&Class[1].Meta;
    memcpy(Class + 1,pnVar14 + 1,__n);
    *(undefined4 *)&Class[1].Meta = uVar2;
    pnVar16 = Class->Meta;
  }
  bVar3 = false;
  bVar4 = true;
  bVar5 = false;
  bVar6 = false;
  for (; bVar1 = *(byte *)pnVar16, bVar1 != 0; pnVar16 = pnVar16 + 1) {
    if ((bVar1 & 0xc0) == 0x40) {
      bVar3 = bVar4;
    }
    if (bVar1 == 0x28) {
      bVar3 = bVar4;
    }
    bVar9 = FilterLookupSet(pnVar16);
    if (bVar9 != 0) {
      bVar5 = bVar4;
    }
    bVar9 = FilterLookupUnSet(pnVar16);
    if (bVar9 != 0) {
      bVar6 = bVar4;
    }
  }
  if (bVar3) {
    local_48._Begin = (char *)0x0;
    local_48._Used = 0;
    for (pnVar14 = Class; pnVar14 != (nodeclass *)0x0; pnVar14 = pnVar14->ParentClass) {
      pnVar16 = pnVar14->Meta;
      if (pnVar16 != (nodemeta *)0x0) {
        for (; bVar1 = *(byte *)pnVar16, bVar1 != 0; pnVar16 = pnVar16 + 1) {
          if (bVar1 == 0x28 || (bVar1 & 0xc0) == 0x40) {
            AddLookup(Class,pnVar16,&local_48);
          }
        }
      }
    }
    if (local_48._Used != 0) {
      pnVar10 = BuildLookup(p,&local_48);
LAB_00103283:
      Class->MetaGet = pnVar10;
    }
  }
  else if (Class->ParentClass != (nodeclass *)0x0) {
    pnVar10 = Class->ParentClass->MetaGet;
    goto LAB_00103283;
  }
  if (bVar5) {
    local_48._Begin = (char *)0x0;
    local_48._Used = 0;
    for (pnVar14 = Class; pnVar14 != (nodeclass *)0x0; pnVar14 = pnVar14->ParentClass) {
      pnVar16 = pnVar14->Meta;
      if (pnVar16 != (nodemeta *)0x0) {
        for (; *(char *)pnVar16 != '\0'; pnVar16 = pnVar16 + 1) {
          bVar9 = FilterLookupSet(pnVar16);
          if (bVar9 != 0) {
            AddLookup(Class,pnVar16,&local_48);
          }
        }
      }
    }
    if (local_48._Used != 0) {
      pnVar10 = BuildLookup(p,&local_48);
LAB_00103305:
      Class->MetaSet = pnVar10;
    }
  }
  else if (Class->ParentClass != (nodeclass *)0x0) {
    pnVar10 = Class->ParentClass->MetaSet;
    goto LAB_00103305;
  }
  if (bVar6) {
    local_48._Begin = (char *)0x0;
    local_48._Used = 0;
    for (pnVar14 = Class; pnVar14 != (nodeclass *)0x0; pnVar14 = pnVar14->ParentClass) {
      pnVar16 = pnVar14->Meta;
      if (pnVar16 != (nodemeta *)0x0) {
        for (; *(char *)pnVar16 != '\0'; pnVar16 = pnVar16 + 1) {
          bVar9 = FilterLookupUnSet(pnVar16);
          if (bVar9 != 0) {
            AddLookup(Class,pnVar16,&local_48);
          }
        }
      }
    }
    if (local_48._Used == 0) goto LAB_00103381;
    pnVar10 = BuildLookup(p,&local_48);
  }
  else {
    if (Class->ParentClass == (nodeclass *)0x0) goto LAB_00103381;
    pnVar10 = Class->ParentClass->MetaUnSet;
  }
  Class->MetaUnSet = pnVar10;
LAB_00103381:
  if (Class->VMTSize < 0x48) {
    __assert_fail("Class->VMTSize >= DEFAULT_VMT",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x490,"void InitClass(nodecontext *, nodeclass *)");
  }
  Class->State = '\x01';
  pnVar16 = Class->Meta;
  pnVar14 = Class + 1;
  do {
    bVar1 = *(byte *)pnVar16;
    if (bVar1 == 0) {
      if ('\0' < Class->State) {
        if (((Class->Flags & 0x21) == 1) &&
           (pnVar12 = NodeCreateFromClass(p,Class,1), pnVar12 == (node *)0x0)) {
          p->NodeCache = (void *)0x0;
          Class->State = -2;
          UnInitClass(p,Class,0);
        }
        if ('\0' < Class->State) {
          pcVar13 = (p->NodeClass)._Begin;
          for (pcVar15 = pcVar13; pcVar15 != pcVar13 + ((p->NodeClass)._Used & 0xfffffffffffffff8);
              pcVar15 = pcVar15 + 8) {
            if ((*(nodeclass **)pcVar15)->ParentClass == Class) {
              InitClass(p,*(nodeclass **)pcVar15);
              pcVar13 = (p->NodeClass)._Begin;
            }
          }
        }
      }
      return;
    }
    if ((~bVar1 & 0xc0) == 0) {
      MetaConst(pnVar16,pnVar14);
    }
    else {
      switch(bVar1) {
      case 0xb:
        Class->Flags = (uint8_t)pnVar16->Data;
        break;
      case 0xc:
        sVar7 = (short)(int)pnVar16->Data;
LAB_0010345f:
        Class->Priority = sVar7 + -1000;
        break;
      case 0x10:
        iVar8 = (*(code *)pnVar16->Data)(*(undefined4 *)&Class[1].Meta,pnVar14);
        if (iVar8 != 0) {
          ReleaseMetaLookup(p,Class);
          p->NodeCache = (void *)0x0;
          Class->State = -2;
        }
        break;
      case 0x12:
        lVar11 = (*(code *)pnVar16->Data)(p,pnVar14,0xb,&Data);
        if (lVar11 != 0) {
          Class->Flags = (uint8_t)Data;
        }
        lVar11 = (*(code *)pnVar16->Data)(p,pnVar14,0xc,&Data);
        if (lVar11 != 0) {
          sVar7 = (short)(undefined4)Data;
          goto LAB_0010345f;
        }
      }
    }
    pnVar16 = pnVar16 + 1;
  } while( true );
}

Assistant:

static void InitClass(nodecontext* p,nodeclass* Class)
{
    const nodeclass* Parent = Class->ParentClass;
    if (Class->State==CLASS_REGISTERED && Class->Meta && (!Class->ParentId || (Parent && Parent->State>=CLASS_INITED)))
    {
        uintptr_t Data;
        const nodemeta* i;

        if (Parent)
        {
            fourcc_t ClassId;

            if (Class->VMTSize == DEFAULT_VMT && Parent->VMTSize > DEFAULT_VMT)
            {
                Class = NodeClassResize(p,Class,Parent->VMTSize);
                if (!Class)
                    return;
            }

            assert(Parent->VMTSize >= DEFAULT_VMT);
            assert(Class->VMTSize >= Parent->VMTSize);
            assert(NodeClass_Context(Parent) == NodeClass_Context(Class));

            ClassId = NodeClass_ClassId(Class);
            memcpy(Class+1,Parent+1,MIN(Class->VMTSize,Parent->VMTSize));
            NodeClass_ClassId(Class) = ClassId;
        }

        BuildMetaLookup(p,Class);

        assert(Class->VMTSize >= DEFAULT_VMT);
        Class->State = CLASS_INITED;

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_VMT)
            {
#if defined(CONFIG_CORECDOC)
                if ((i->Meta & ~META_MODE_MASK)==TYPE_FUNC) // otherwise it might be some doc items
#endif
                    MetaConst(i,Class+1);
            }
            else
            switch (i->Meta)
            {
            case META_CLASS_VMT_CREATE:
                if (((int(*)(fourcc_t,void*))i->Data)(NodeClass_ClassId(Class),Class+1) != ERR_NONE)
                {
                    ReleaseMetaLookup(p,Class);
                    p->NodeCache = NULL;
                    Class->State = CLASS_FAILED;
                }
                break;

            case META_CLASS_META:
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_FLAGS,&Data))
                    Class->Flags = (uint8_t)Data;
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_PRIORITY,&Data))
                    Class->Priority = (int16_t)(Data-PRI_DEFAULT);
                break;

            case META_CLASS_FLAGS:
                Class->Flags = (uint8_t)i->Data;
                break;

            case META_CLASS_PRIORITY:
                Class->Priority = (int16_t)(i->Data-PRI_DEFAULT);
                break;
            }
        }

        if (Class->State>=CLASS_INITED && (Class->Flags & (CFLAG_SINGLETON|CFLAG_OWN_MEMORY))==CFLAG_SINGLETON && !NodeCreateFromClass(p,Class,1))
        {
            p->NodeCache = NULL;
            Class->State = CLASS_FAILED;
            UnInitClass(p,Class,0); // just to call META_CLASS_VMT_DELETE
        }

        if (Class->State>=CLASS_INITED)
        {
            nodeclass** nc;
            for (nc=ARRAYBEGIN(p->NodeClass,nodeclass*);nc!=ARRAYEND(p->NodeClass,nodeclass*);++nc)
                if ((*nc)->ParentClass == Class)
                    InitClass(p,*nc);
        }
    }
}